

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckNamespace.cxx
# Opt level: O2

bool __thiscall kws::Parser::CheckNamespace(Parser *this,char *name,bool doNotCheckMain)

{
  bool bVar1;
  long lVar2;
  char *__s;
  size_t pos;
  undefined7 in_register_00000011;
  string *this_00;
  bool bVar3;
  Error error;
  string names;
  string nspace;
  string local_68;
  string nameSpace;
  
  if ((int)CONCAT71(in_register_00000011,doNotCheckMain) != 0) {
    lVar2 = std::__cxx11::string::find((char *)&this->m_BufferNoComment,0x1627fa);
    if (lVar2 != -1) {
      return false;
    }
    lVar2 = std::__cxx11::string::find((char *)&this->m_BufferNoComment,0x162800);
    if (lVar2 == -1) {
      return false;
    }
  }
  this->m_TestsDone[0x11] = true;
  __s = (char *)operator_new__(0xff);
  snprintf(__s,0xff,"The first namespace of the file should match %s");
  std::__cxx11::string::assign((char *)(this->m_TestsDescription + 0x11));
  operator_delete__(__s);
  std::__cxx11::string::string((string *)&nameSpace,"",(allocator *)&error);
  pos = std::__cxx11::string::find((char *)&this->m_BufferNoComment,0x162519);
  if (pos == 0xffffffffffffffff) {
    this_00 = &error.description;
    error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
    error.description._M_string_length = 0;
    error.description.field_2._M_local_buf[0] = '\0';
    error.line = GetLineNumber(this,0,true);
    error.number = 0x11;
    error.line2 = error.line;
    std::__cxx11::string::assign((char *)this_00);
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&error);
  }
  else {
    std::__cxx11::string::string((string *)&local_68,"",(allocator *)&names);
    FindPreviousWord((string *)&error,this,pos,false,&local_68);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &error,"using");
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::~string((string *)&local_68);
    bVar3 = true;
    if (bVar1) goto LAB_001430c2;
    std::__cxx11::string::string((string *)&names,name,(allocator *)&error);
    FindNextWord_abi_cxx11_(&nspace,this,pos);
    bVar1 = std::operator!=(&nspace,&names);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&nspace);
      std::__cxx11::string::~string((string *)&names);
      goto LAB_001430c2;
    }
    error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
    error.description._M_string_length = 0;
    error.description.field_2._M_local_buf[0] = '\0';
    error.line = GetLineNumber(this,pos,true);
    error.number = 0x11;
    error.line2 = error.line;
    std::__cxx11::string::assign((char *)&error.description);
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&error);
    std::__cxx11::string::~string((string *)&error.description);
    std::__cxx11::string::~string((string *)&nspace);
    this_00 = &names;
  }
  std::__cxx11::string::~string((string *)this_00);
  bVar3 = false;
LAB_001430c2:
  std::__cxx11::string::~string((string *)&nameSpace);
  return bVar3;
}

Assistant:

bool Parser::CheckNamespace(const char* name,bool doNotCheckMain)
{
  // If there is a 'int main' keyword in the file we do not check
  // Or if there is not keyword class
  if(doNotCheckMain)
    {
    if( (m_BufferNoComment.find("main ",0) != std::string::npos)
       || (m_BufferNoComment.find("class ",0) == std::string::npos)
      )
      {
      return false;
      }
    }

  m_TestsDone[NAMESPACE] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"The first namespace of the file should match %s",name);
  m_TestsDescription[NAMESPACE] = val;
  delete [] val;

  std::string nameSpace = "";

  size_t pos = m_BufferNoComment.find("namespace",0);

  if(pos == std::string::npos)
    {
    Error error;
    error.line = this->GetLineNumber(0,true);
    error.line2 = error.line;
    error.number = NAMESPACE;
    error.description = "namespace not defined";
    m_ErrorList.push_back(error);
    return false;
    }

  
  // check that the word is not using namespace
  bool ok = true;
  if(this->FindPreviousWord(pos) == "using")
    {
    ok = false;
    }

  if(ok)
    {
    std::string names = name;
    // extract the namespace
    std::string nspace = this->FindNextWord(pos);
    if(nspace != names)
      {
      Error error;
      error.line = this->GetLineNumber(pos,true);
      error.line2 = error.line;
      error.number = NAMESPACE;
      error.description = "namespace is wrong";
      m_ErrorList.push_back(error);
      return false;
      }
    }

  /*
  // Now search if we have other namespaces
  while(pos!= std::string::npos && ok)
    {
    pos = buffer.find("namespace",pos+1);
    // check that the word is not using namespace
    use = buffer.find("using",pos-20);

    ok = true;

    if((use!=-1 && pos-use<20) || (pos == -1))
      {
      ok = false;
      }

    if(ok)
      {
      // extract the namespace
      long int bracket = buffer.find("{",pos);
      long int closing = FindClosingBracket(buffer,bracket);

      // Find the number of } after closing
      int num = 0;
      int close = closing+1;
      while(buffer.find("}",close) != -1)
        {
        num++;
        close=buffer.find("}",close);
        close++;
        }

      if(bracket != -1 && bracket-pos-10<10 && num==nNameSpace)
        {
        std::string name = buffer.substr(pos+10,bracket-pos-10);
        RemoveCtrlN(name);
        RemoveChar(name,' ');
        RemoveCtrlN(name);
        nameSpace += "::";
        nameSpace += name;
        nNameSpace++;
        }
      }
    }
    */

  return true;
}